

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abs.h
# Opt level: O0

Vec_Int_t * Ga2_ObjLeaves(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  Ga2_ObjLeaves::v.nSize = Ga2_ObjLeaveNum(p,pObj);
  Ga2_ObjLeaves::v.pArray = Ga2_ObjLeavePtr(p,pObj);
  return &Ga2_ObjLeaves::v;
}

Assistant:

static inline Vec_Int_t * Ga2_ObjLeaves( Gia_Man_t * p, Gia_Obj_t * pObj )          { static Vec_Int_t v; v.nSize = Ga2_ObjLeaveNum(p, pObj), v.pArray = Ga2_ObjLeavePtr(p, pObj); return &v;       }